

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

void __thiscall
booster::locale::basic_message<char>::basic_message
          (basic_message<char> *this,string_type *context,string_type *id)

{
  pointer pcVar1;
  
  this->n_ = 0;
  this->c_id_ = (char_type *)0x0;
  this->c_context_ = (char_type *)0x0;
  this->c_plural_ = (char_type *)0x0;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  pcVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id_,pcVar1,pcVar1 + id->_M_string_length);
  (this->context_)._M_dataplus._M_p = (pointer)&(this->context_).field_2;
  pcVar1 = (context->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->context_,pcVar1,pcVar1 + context->_M_string_length);
  (this->plural_)._M_dataplus._M_p = (pointer)&(this->plural_).field_2;
  (this->plural_)._M_string_length = 0;
  (this->plural_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit basic_message(string_type const &context,string_type const &id) :
                n_(0),
                c_id_(0),
                c_context_(0),
                c_plural_(0),
                id_(id),
                context_(context)
            {
            }